

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

MockableDatabase * wallet::GetMockableDatabase(CWallet *wallet)

{
  long lVar1;
  WalletDatabase *pWVar2;
  MockableDatabase *pMVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = CWallet::GetDatabase(wallet);
  pMVar3 = (MockableDatabase *)
           __dynamic_cast(pWVar2,&WalletDatabase::typeinfo,&MockableDatabase::typeinfo,0);
  if (pMVar3 == (MockableDatabase *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_bad_cast();
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pMVar3;
  }
  __stack_chk_fail();
}

Assistant:

MockableDatabase& GetMockableDatabase(CWallet& wallet)
{
    return dynamic_cast<MockableDatabase&>(wallet.GetDatabase());
}